

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notify_bind.c
# Opt level: O1

int socket_conv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  mpt_named_traits *pmVar1;
  mpt_type_t mVar2;
  
  pmVar1 = mpt_input_type_traits();
  if (pmVar1 == (mpt_named_traits *)0x0) {
    mVar2 = 0x100;
  }
  else {
    mVar2 = pmVar1->type;
    if (mVar2 == type) goto LAB_0010647b;
  }
  if (type != 0x100) {
    if (type == 1) {
      if (ptr != (void *)0x0) {
        *(undefined4 *)ptr = *(undefined4 *)&val[1]._vptr;
      }
    }
    else {
      if (type != 0) {
        return -3;
      }
      if (ptr != (void *)0x0) {
        *(char **)ptr = "\x01";
      }
    }
    return (int)mVar2;
  }
LAB_0010647b:
  if (ptr != (void *)0x0) {
    *(mpt_convertable **)ptr = val;
  }
  return 1;
}

Assistant:

static int socket_conv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	struct socketInput *sd = (void *) val;
	const MPT_STRUCT(named_traits) *traits = mpt_input_type_traits();
	MPT_TYPE(type) me;
	
	if (!traits) {
		me = MPT_ENUM(TypeMetaPtr);
	}
	else if (type == (me = traits->type)) {
		if (ptr) *((void **) ptr) = &sd->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (!type) {
		static const char fmt[] = { MPT_ENUM(TypeUnixSocket), 0 };
		if (ptr) *((const char **) ptr) = fmt;
		return me;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((void **) ptr) = &sd->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (type == MPT_ENUM(TypeUnixSocket)) {
		if (ptr) *((MPT_STRUCT(socket) *) ptr) = sd->sock;
		return me;
	}
	return MPT_ERROR(BadType);
}